

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessbackend_p.cpp
# Opt level: O1

void QNetworkAccessBackend::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        return;
      }
    }
    else {
      puVar3 = (undefined8 *)*_a;
    }
    *puVar3 = 0;
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      QNetworkReplyImplPrivate::backendNotify
                (*(QNetworkReplyImplPrivate **)(*(long *)(_o + 8) + 0xa0),NotifyDownstreamReadyWrite
                );
      break;
    case 1:
      QNetworkReplyImplPrivate::finished(*(QNetworkReplyImplPrivate **)(*(long *)(_o + 8) + 0xa0));
      break;
    case 2:
      QNetworkReplyImplPrivate::error
                (*(QNetworkReplyImplPrivate **)(*(long *)(_o + 8) + 0xa0),*_a[1],(QString *)_a[2]);
      break;
    case 3:
      proxyAuthenticationRequired((QNetworkAccessBackend *)_o,(QNetworkProxy *)_a[1],*_a[2]);
      break;
    case 4:
      lVar1 = *(long *)(_o + 8);
      lVar2 = *(long *)(lVar1 + 0xa0);
      QNetworkAccessManagerPrivate::authenticationRequired
                (*(QNetworkAccessManagerPrivate **)(lVar1 + 0xa8),*_a[1],
                 *(QNetworkReply **)(lVar2 + 8),*(bool *)(lVar1 + 0xb1),(QUrl *)(lVar2 + 0x1e0),
                 (QUrl *)(lVar2 + 0x288),true);
      break;
    case 5:
      QNetworkReplyImplPrivate::metaDataChanged
                (*(QNetworkReplyImplPrivate **)(*(long *)(_o + 8) + 0xa0));
      break;
    case 6:
      QNetworkReplyImplPrivate::redirectionRequested
                (*(QNetworkReplyImplPrivate **)(*(long *)(_o + 8) + 0xa0),(QUrl *)_a[1]);
    }
  }
  return;
}

Assistant:

void QNetworkAccessBackend::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkAccessBackend *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->readyRead(); break;
        case 1: _t->finished(); break;
        case 2: _t->error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 4: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[1]))); break;
        case 5: _t->metaDataChanged(); break;
        case 6: _t->redirectionRequested((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        }
    }
}